

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_merge_node_equal(lyd_node *node1,lyd_node *node2)

{
  LYS_NODE LVar1;
  lys_node *plVar2;
  int iVar3;
  
  plVar2 = node1->schema;
  LVar1 = plVar2->nodetype;
  if ((int)LVar1 < 0x20) {
    if (7 < (int)LVar1) {
      if (LVar1 == LYS_LEAFLIST) {
        if ((char)node1->validity < '\0') {
          if ((plVar2->flags & 2) != 0) {
            return 0;
          }
          __assert_fail("node1->schema->flags & LYS_CONFIG_R",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                        ,0xa82,"int lyd_merge_node_equal(struct lyd_node *, struct lyd_node *)");
        }
        iVar3 = lyd_list_equal(node1,node2,1);
        if (iVar3 != 1) {
          return iVar3;
        }
        if ((node1->schema->flags & 2) == 0) {
          return 1;
        }
      }
      else {
        if (LVar1 != LYS_LIST) goto LAB_00170dc1;
        if ((char)node1->validity < '\0') {
          if (plVar2->padding[2] == '\0') {
            return 0;
          }
          __assert_fail("!((struct lys_node_list *)node1->schema)->keys_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                        ,0xa90,"int lyd_merge_node_equal(struct lyd_node *, struct lyd_node *)");
        }
        iVar3 = lyd_list_equal(node1,node2,1);
        if (iVar3 != 1) {
          return iVar3;
        }
        if (node1->schema->padding[2] != '\0') {
          return 1;
        }
      }
      node1->validity = node1->validity | 0x80;
      return 2;
    }
    if (LVar1 == LYS_CONTAINER) {
      return 1;
    }
    if (LVar1 == LYS_LEAF) {
      return 1;
    }
  }
  else if ((int)LVar1 < 0x100) {
    if (LVar1 == LYS_ANYXML) {
      return 1;
    }
    if (LVar1 == LYS_NOTIF) {
      return 1;
    }
  }
  else {
    if (LVar1 == LYS_RPC) {
      return 1;
    }
    if (LVar1 == LYS_ACTION) {
      return 1;
    }
    if (LVar1 == LYS_ANYDATA) {
      return 1;
    }
  }
LAB_00170dc1:
  ly_log(node2->schema->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
         ,0xa9f);
  return -1;
}

Assistant:

static int
lyd_merge_node_equal(struct lyd_node *node1, struct lyd_node *node2)
{
    int ret;

    switch (node1->schema->nodetype) {
    case LYS_CONTAINER:
    case LYS_LEAF:
    case LYS_ANYXML:
    case LYS_ANYDATA:
    case LYS_RPC:
    case LYS_ACTION:
    case LYS_NOTIF:
        return 1;
    case LYS_LEAFLIST:
        if (node1->validity & LYD_VAL_INUSE) {
            /* this instance was already matched, we want to find another so that the number of the istances matches */
            assert(node1->schema->flags & LYS_CONFIG_R);
            return 0;
        }

        ret = lyd_list_equal(node1, node2, 1);
        if ((ret == 1) && (node1->schema->flags & LYS_CONFIG_R)) {
            /* mark it as matched */
            node1->validity |= LYD_VAL_INUSE;
            ret = 2;
        }
        return ret;
    case LYS_LIST:
        if (node1->validity & LYD_VAL_INUSE) {
            /* this instance was already matched, we want to find another so that the number of the istances matches */
            assert(!((struct lys_node_list *)node1->schema)->keys_size);
            return 0;
        }

        ret = lyd_list_equal(node1, node2, 1);
        if ((ret == 1) && !((struct lys_node_list *)node1->schema)->keys_size) {
            /* mark it as matched */
            node1->validity |= LYD_VAL_INUSE;
            ret = 2;
        }
        return ret;
    default:
        break;
    }

    LOGINT(node2->schema->module->ctx);
    return -1;
}